

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O0

FunctionValue *
GetFunctionForType(FunctionValue *__return_storage_ptr__,ExpressionContext *ctx,SynBase *source,
                  ExprBase *value,TypeFunction *type)

{
  FunctionData *pFVar1;
  FunctionValue proto;
  ArrayView<ArgumentData> arguments_00;
  IntrusiveList<TypeHandle> arguments_01;
  int iVar2;
  bool bVar3;
  uint uVar4;
  uint uVar5;
  FunctionValue *pFVar6;
  TypeBase *pTVar7;
  TypeHandle *this;
  bool_type bVar8;
  TypeFunction *local_bb8;
  TypeFunction **local_ba8;
  ArrayView<ArgumentData> local_ad8;
  IntrusiveList<TypeHandle> local_ac8;
  SynBase *local_ab8;
  FunctionData *pFStack_ab0;
  ExprBase *local_aa8;
  FunctionValue local_aa0;
  FunctionData *local_a88;
  FunctionData *function;
  _func_int **local_a50;
  TypeHandle *curr;
  SmallArray<ArgumentData,_32U> arguments_1;
  TypeFunction *bestTarget;
  TypeBase *match_1;
  TypeHandle *rhs_1;
  TypeHandle *lhs_1;
  IntrusiveList<MatchData> aliases_1;
  uint matches;
  TypeBase *match;
  TypeHandle *rhs;
  TypeHandle *lhs;
  IntrusiveList<TypeHandle> arguments;
  TypeBase *returnType;
  IntrusiveList<MatchData> aliases;
  TypeFunction *functionType;
  TypeFunction *pTStack_390;
  uint i;
  TypeFunction *bestGenericMatchTarget;
  FunctionValue bestGenericMatch;
  TypeFunction *bestMatchTarget;
  FunctionValue bestMatch;
  undefined1 local_340 [8];
  SmallArray<FunctionValue,_32U> functions;
  TypeFunction *type_local;
  ExprBase *value_local;
  SynBase *source_local;
  ExpressionContext *ctx_local;
  
  functions.allocator = (Allocator *)type;
  SmallArray<FunctionValue,_32U>::SmallArray
            ((SmallArray<FunctionValue,_32U> *)local_340,ctx->allocator);
  GetNodeFunctions(ctx,source,value,(SmallArray<FunctionValue,_32U> *)local_340);
  bVar3 = SmallArray<FunctionValue,_32U>::empty((SmallArray<FunctionValue,_32U> *)local_340);
  if (!bVar3) {
    FunctionValue::FunctionValue((FunctionValue *)&bestMatchTarget);
    bestGenericMatch.context = (ExprBase *)0x0;
    FunctionValue::FunctionValue((FunctionValue *)&bestGenericMatchTarget);
    pTStack_390 = (TypeFunction *)0x0;
    for (functionType._4_4_ = 0;
        uVar4 = SmallArray<FunctionValue,_32U>::size((SmallArray<FunctionValue,_32U> *)local_340),
        functionType._4_4_ < uVar4; functionType._4_4_ = functionType._4_4_ + 1) {
      pFVar6 = SmallArray<FunctionValue,_32U>::operator[]
                         ((SmallArray<FunctionValue,_32U> *)local_340,functionType._4_4_);
      aliases.tail = (MatchData *)pFVar6->function->type;
      uVar4 = IntrusiveList<TypeHandle>::size
                        ((IntrusiveList<TypeHandle> *)(functions.allocator + 0xd));
      uVar5 = IntrusiveList<TypeHandle>::size((IntrusiveList<TypeHandle> *)&aliases.tail[3].type);
      if (uVar4 == uVar5) {
        if (((ulong)functions.allocator[7]._vptr_Allocator & 0x100000000) == 0) {
          if ((aliases.tail[1].field_0x1c & 1) == 0) {
            if (aliases.tail == (MatchData *)functions.allocator) {
              bVar8 = FunctionValue::operator_cast_to_function_pointer
                                ((FunctionValue *)&bestMatchTarget);
              if (bVar8 != 0) {
                FunctionValue::FunctionValue(__return_storage_ptr__);
                goto LAB_00181a19;
              }
              pFVar6 = SmallArray<FunctionValue,_32U>::operator[]
                                 ((SmallArray<FunctionValue,_32U> *)local_340,functionType._4_4_);
              bestMatchTarget = (TypeFunction *)pFVar6->source;
              bestMatch.source = (SynBase *)pFVar6->function;
              bestMatch.function = (FunctionData *)pFVar6->context;
              bestGenericMatch.context = (ExprBase *)functions.allocator;
            }
          }
          else {
            aliases_1.tail._4_4_ = 0;
            IntrusiveList<MatchData>::IntrusiveList((IntrusiveList<MatchData> *)&lhs_1);
            match_1 = (TypeBase *)functions.allocator[0xd]._vptr_Allocator;
            for (rhs_1 = (TypeHandle *)aliases.tail[3].type;
                rhs_1 != (TypeHandle *)0x0 && match_1 != (TypeBase *)0x0; rhs_1 = rhs_1->next) {
              pTVar7 = MatchGenericType(ctx,source,rhs_1->type,(TypeBase *)match_1->_vptr_TypeBase,
                                        (IntrusiveList<MatchData> *)&lhs_1,true);
              if ((pTVar7 != (TypeBase *)0x0) && ((pTVar7->isGeneric & 1U) == 0)) {
                aliases_1.tail._4_4_ = aliases_1.tail._4_4_ + 1;
              }
              match_1 = *(TypeBase **)&match_1->typeID;
            }
            if (((TypeBase *)aliases.tail[3].name == ctx->typeAuto) ||
               (aliases.tail[3].name == (SynIdentifier *)functions.allocator[0xc]._vptr_Allocator))
            {
              aliases_1.tail._4_4_ = aliases_1.tail._4_4_ + 1;
            }
            iVar2 = aliases_1.tail._4_4_;
            uVar4 = IntrusiveList<TypeHandle>::size
                              ((IntrusiveList<TypeHandle> *)(functions.allocator + 0xd));
            if (iVar2 == uVar4 + 1) {
              bVar8 = FunctionValue::operator_cast_to_function_pointer
                                ((FunctionValue *)&bestGenericMatchTarget);
              if (bVar8 != 0) {
                FunctionValue::FunctionValue(__return_storage_ptr__);
                goto LAB_00181a19;
              }
              pFVar6 = SmallArray<FunctionValue,_32U>::operator[]
                                 ((SmallArray<FunctionValue,_32U> *)local_340,functionType._4_4_);
              bestGenericMatchTarget = (TypeFunction *)pFVar6->source;
              bestGenericMatch.source = (SynBase *)pFVar6->function;
              bestGenericMatch.function = (FunctionData *)pFVar6->context;
              pTStack_390 = (TypeFunction *)functions.allocator;
            }
          }
        }
        else {
          IntrusiveList<MatchData>::IntrusiveList((IntrusiveList<MatchData> *)&returnType);
          arguments.tail =
               (TypeHandle *)
               MatchGenericType(ctx,source,(TypeBase *)functions.allocator[0xc]._vptr_Allocator,
                                (TypeBase *)aliases.tail[3].name,
                                (IntrusiveList<MatchData> *)&returnType,true);
          IntrusiveList<TypeHandle>::IntrusiveList((IntrusiveList<TypeHandle> *)&lhs);
          match = aliases.tail[3].type;
          for (rhs = (TypeHandle *)functions.allocator[0xd]._vptr_Allocator;
              rhs != (TypeHandle *)0x0 && match != (TypeBase *)0x0; rhs = rhs->next) {
            pTVar7 = MatchGenericType(ctx,source,rhs->type,(TypeBase *)match->_vptr_TypeBase,
                                      (IntrusiveList<MatchData> *)&returnType,true);
            if ((pTVar7 != (TypeBase *)0x0) && ((pTVar7->isGeneric & 1U) == 0)) {
              this = ExpressionContext::get<TypeHandle>(ctx);
              TypeHandle::TypeHandle(this,pTVar7);
              IntrusiveList<TypeHandle>::push_back((IntrusiveList<TypeHandle> *)&lhs,this);
            }
            match = *(TypeBase **)&match->typeID;
          }
          if (arguments.tail != (TypeHandle *)0x0) {
            uVar4 = IntrusiveList<TypeHandle>::size((IntrusiveList<TypeHandle> *)&lhs);
            uVar5 = IntrusiveList<TypeHandle>::size
                              ((IntrusiveList<TypeHandle> *)(functions.allocator + 0xd));
            if (uVar4 == uVar5) {
              bVar8 = FunctionValue::operator_cast_to_function_pointer
                                ((FunctionValue *)&bestGenericMatchTarget);
              if (bVar8 != 0) {
                FunctionValue::FunctionValue(__return_storage_ptr__);
                goto LAB_00181a19;
              }
              pFVar6 = SmallArray<FunctionValue,_32U>::operator[]
                                 ((SmallArray<FunctionValue,_32U> *)local_340,functionType._4_4_);
              bestGenericMatch.function = (FunctionData *)pFVar6->context;
              bestGenericMatchTarget = (TypeFunction *)pFVar6->source;
              bestGenericMatch.source = (SynBase *)pFVar6->function;
              arguments_01.tail = arguments.head;
              arguments_01.head = lhs;
              pTStack_390 = ExpressionContext::GetFunctionType
                                      (ctx,source,(TypeBase *)arguments.tail,arguments_01);
            }
          }
        }
      }
    }
    bVar8 = FunctionValue::operator_cast_to_function_pointer((FunctionValue *)&bestMatchTarget);
    if (bVar8 == 0) {
      local_ba8 = &bestGenericMatchTarget;
    }
    else {
      local_ba8 = &bestMatchTarget;
    }
    __return_storage_ptr__->context = (ExprBase *)local_ba8[2];
    pFVar1 = (FunctionData *)local_ba8[1];
    __return_storage_ptr__->source = (SynBase *)*local_ba8;
    __return_storage_ptr__->function = pFVar1;
    bVar8 = FunctionValue::operator_cast_to_function_pointer((FunctionValue *)&bestMatchTarget);
    if (bVar8 == 0) {
      local_bb8 = pTStack_390;
    }
    else {
      local_bb8 = (TypeFunction *)bestGenericMatch.context;
    }
    arguments_1.allocator = (Allocator *)local_bb8;
    bVar8 = FunctionValue::operator_cast_to_function_pointer(__return_storage_ptr__);
    if (bVar8 != 0) {
      SmallArray<ArgumentData,_32U>::SmallArray
                ((SmallArray<ArgumentData,_32U> *)&curr,ctx->allocator);
      for (local_a50 = arguments_1.allocator[0xd]._vptr_Allocator; local_a50 != (_func_int **)0x0;
          local_a50 = (_func_int **)local_a50[1]) {
        ArgumentData::ArgumentData
                  ((ArgumentData *)&function,source,false,(SynIdentifier *)0x0,
                   (TypeBase *)*local_a50,(ExprBase *)0x0);
        SmallArray<ArgumentData,_32U>::push_back
                  ((SmallArray<ArgumentData,_32U> *)&curr,(ArgumentData *)&function);
      }
      local_a88 = __return_storage_ptr__->function;
      bVar3 = ExpressionContext::IsGenericFunction(ctx,local_a88);
      if (bVar3) {
        local_aa8 = __return_storage_ptr__->context;
        local_ab8 = __return_storage_ptr__->source;
        pFStack_ab0 = __return_storage_ptr__->function;
        IntrusiveList<TypeHandle>::IntrusiveList(&local_ac8);
        ArrayView<ArgumentData>::ArrayView<32u>(&local_ad8,(SmallArray<ArgumentData,_32U> *)&curr);
        proto.function = pFStack_ab0;
        proto.source = local_ab8;
        proto.context = local_aa8;
        arguments_00.count = local_ad8.count;
        arguments_00._12_4_ = local_ad8._12_4_;
        arguments_00.data = local_ad8.data;
        CreateGenericFunctionInstance(&local_aa0,ctx,source,proto,local_ac8,arguments_00,false);
        __return_storage_ptr__->source = local_aa0.source;
        __return_storage_ptr__->function = local_aa0.function;
        __return_storage_ptr__->context = local_aa0.context;
      }
      bVar8 = FunctionValue::operator_cast_to_function_pointer(__return_storage_ptr__);
      if (bVar8 == 0) {
LAB_001819db:
        bVar3 = false;
      }
      else {
        if ((TypeBase *)arguments_1.allocator[0xc]._vptr_Allocator == ctx->typeAuto) {
          arguments_1.allocator =
               (Allocator *)
               ExpressionContext::GetFunctionType
                         (ctx,source,__return_storage_ptr__->function->type->returnType,
                          *(IntrusiveList<TypeHandle> *)(arguments_1.allocator + 0xd));
        }
        if (__return_storage_ptr__->function->type != (TypeFunction *)arguments_1.allocator)
        goto LAB_001819db;
        bVar3 = true;
      }
      SmallArray<ArgumentData,_32U>::~SmallArray((SmallArray<ArgumentData,_32U> *)&curr);
      if (bVar3) goto LAB_00181a19;
    }
  }
  FunctionValue::FunctionValue(__return_storage_ptr__);
LAB_00181a19:
  SmallArray<FunctionValue,_32U>::~SmallArray((SmallArray<FunctionValue,_32U> *)local_340);
  return __return_storage_ptr__;
}

Assistant:

FunctionValue GetFunctionForType(ExpressionContext &ctx, SynBase *source, ExprBase *value, TypeFunction *type)
{
	// Collect a set of available functions
	SmallArray<FunctionValue, 32> functions(ctx.allocator);

	GetNodeFunctions(ctx, source, value, functions);

	if(!functions.empty())
	{
		FunctionValue bestMatch;
		TypeFunction *bestMatchTarget = NULL;

		FunctionValue bestGenericMatch;
		TypeFunction *bestGenericMatchTarget = NULL;

		for(unsigned i = 0; i < functions.size(); i++)
		{
			TypeFunction *functionType = functions[i].function->type;

			if(type->arguments.size() != functionType->arguments.size())
				continue;

			if(type->isGeneric)
			{
				IntrusiveList<MatchData> aliases;

				TypeBase *returnType = MatchGenericType(ctx, source, type->returnType, functionType->returnType, aliases, true);
				IntrusiveList<TypeHandle> arguments;

				for(TypeHandle *lhs = type->arguments.head, *rhs = functionType->arguments.head; lhs && rhs; lhs = lhs->next, rhs = rhs->next)
				{
					TypeBase *match = MatchGenericType(ctx, source, lhs->type, rhs->type, aliases, true);

					if(match && !match->isGeneric)
						arguments.push_back(new (ctx.get<TypeHandle>()) TypeHandle(match));
				}

				if(returnType && arguments.size() == type->arguments.size())
				{
					if(bestGenericMatch)
						return FunctionValue();

					bestGenericMatch = functions[i];
					bestGenericMatchTarget = ctx.GetFunctionType(source, returnType, arguments);
				}
			}
			else if(functionType->isGeneric)
			{
				unsigned matches = 0;

				IntrusiveList<MatchData> aliases;

				for(TypeHandle *lhs = functionType->arguments.head, *rhs = type->arguments.head; lhs && rhs; lhs = lhs->next, rhs = rhs->next)
				{
					TypeBase *match = MatchGenericType(ctx, source, lhs->type, rhs->type, aliases, true);

					if(match && !match->isGeneric)
						matches++;
				}

				if(functionType->returnType == ctx.typeAuto || functionType->returnType == type->returnType)
					matches++;

				if(matches == type->arguments.size() + 1)
				{
					if(bestGenericMatch)
						return FunctionValue();

					bestGenericMatch = functions[i];
					bestGenericMatchTarget = type;
				}
			}
			else if(functionType == type)
			{
				if(bestMatch)
					return FunctionValue();

				bestMatch = functions[i];
				bestMatchTarget = type;
			}
		}

		FunctionValue bestOverload = bestMatch ? bestMatch : bestGenericMatch;
		TypeFunction *bestTarget = bestMatch ? bestMatchTarget : bestGenericMatchTarget;

		if(bestOverload)
		{
			SmallArray<ArgumentData, 32> arguments(ctx.allocator);

			for(TypeHandle *curr = bestTarget->arguments.head; curr; curr = curr->next)
				arguments.push_back(ArgumentData(source, false, NULL, curr->type, NULL));

			FunctionData *function = bestOverload.function;

			if(ctx.IsGenericFunction(function))
				bestOverload = CreateGenericFunctionInstance(ctx, source, bestOverload, IntrusiveList<TypeHandle>(), arguments, false);

			if(bestOverload)
			{
				if(bestTarget->returnType == ctx.typeAuto)
					bestTarget = ctx.GetFunctionType(source, bestOverload.function->type->returnType, bestTarget->arguments);

				if(bestOverload.function->type == bestTarget)
					return bestOverload;
			}
		}
	}

	return FunctionValue();
}